

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_read_deep_chunk(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
                   void *packed_data,void *sample_data)

{
  long lVar1;
  long in_RCX;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  long in_R8;
  exr_const_priv_part_t part;
  _INTERNAL_EXR_READ_MODE rmode;
  int64_t nread;
  uint64_t toread;
  uint64_t dataoffset;
  exr_result_t rv;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  long local_28;
  int *local_20;
  char *local_10;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else if (*in_RDI == '\0') {
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == (int *)0x0) {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else if ((*in_RDX < 0) || (*(int *)(lVar1 + 0xf4) <= *in_RDX)) {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,"invalid chunk index (%d) vs part chunk count %d",*in_RDX,
                             *(undefined4 *)(lVar1 + 0xf4));
      }
      else if ((uint)*(byte *)((long)in_RDX + 0x16) == (*(uint *)(lVar1 + 4) & 0xff)) {
        if ((uint)*(byte *)((long)in_RDX + 0x17) == (*(uint *)(lVar1 + 0xb0) & 0xff)) {
          if ((*(long *)(in_RDI + 0x98) < 1) ||
             (*(ulong *)(in_RDX + 0xc) <= *(ulong *)(in_RDI + 0x98))) {
            if ((*(long *)(in_RDI + 0x98) < 1) ||
               (*(ulong *)(in_RDX + 6) <= *(ulong *)(in_RDI + 0x98))) {
              local_34 = 0;
              local_28 = in_RCX;
              local_20 = in_RDX;
              local_10 = in_RDI;
              if ((in_R8 != 0) && (*(long *)(in_RDX + 0xe) != 0)) {
                local_40 = *(undefined8 *)(in_RDX + 0xc);
                local_48 = *(undefined8 *)(in_RDX + 0xe);
                local_50 = 0;
                local_34 = (**(code **)(in_RDI + 0x28))(in_RDI,in_R8,local_48,&local_40,&local_50,0)
                ;
              }
              if (local_34 == 0) {
                if ((local_28 != 0) && (*(long *)(local_20 + 8) != 0)) {
                  local_40 = *(undefined8 *)(local_20 + 6);
                  local_48 = *(undefined8 *)(local_20 + 8);
                  local_50 = 0;
                  local_34 = (**(code **)(local_10 + 0x28))
                                       (local_10,local_28,local_48,&local_40,&local_50,0);
                }
                local_4 = local_34;
              }
              else {
                local_4 = local_34;
              }
            }
            else {
              local_4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "chunk block info data offset (%lu) past end of file (%ld)",
                                   *(undefined8 *)(in_RDX + 6),*(undefined8 *)(in_RDI + 0x98));
            }
          }
          else {
            local_4 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,3,
                                 "chunk block info sample count offset (%lu) past end of file (%ld)"
                                 ,*(undefined8 *)(in_RDX + 0xc),*(undefined8 *)(in_RDI + 0x98));
          }
        }
        else {
          local_4 = (**(code **)(in_RDI + 0x40))
                              (in_RDI,3,"mismatched compression type for chunk block info");
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,3,"mismatched storage type for chunk block info");
      }
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,7);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_read_deep_chunk (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    void*                   packed_data,
    void*                   sample_data)
{
    exr_result_t                 rv;
    uint64_t                     dataoffset, toread;
    int64_t                      nread;
    enum _INTERNAL_EXR_READ_MODE rmode = EXR_MUST_READ_ALL;
    EXR_READONLY_AND_DEFINE_PART (part_index);

    if (!cinfo) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (cinfo->idx < 0 || cinfo->idx >= part->chunk_count)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "invalid chunk index (%d) vs part chunk count %d",
            cinfo->idx,
            part->chunk_count);
    if (cinfo->type != (uint8_t) part->storage_mode)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched storage type for chunk block info");
    if (cinfo->compression != (uint8_t) part->comp_type)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched compression type for chunk block info");

    if (ctxt->file_size > 0 &&
        cinfo->sample_count_data_offset > (uint64_t) ctxt->file_size)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "chunk block info sample count offset (%" PRIu64
            ") past end of file (%" PRId64 ")",
            cinfo->sample_count_data_offset,
            ctxt->file_size);

    if (ctxt->file_size > 0 && cinfo->data_offset > (uint64_t) ctxt->file_size)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "chunk block info data offset (%" PRIu64
            ") past end of file (%" PRId64 ")",
            cinfo->data_offset,
            ctxt->file_size);

    rv = EXR_ERR_SUCCESS;
    if (sample_data && cinfo->sample_count_table_size > 0)
    {
        dataoffset = cinfo->sample_count_data_offset;
        toread     = cinfo->sample_count_table_size;
        nread      = 0;
        rv         = ctxt->do_read (
            ctxt, sample_data, toread, &dataoffset, &nread, rmode);
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    if (packed_data && cinfo->packed_size > 0)
    {
        dataoffset = cinfo->data_offset;
        toread     = cinfo->packed_size;
        nread      = 0;
        rv         = ctxt->do_read (
            ctxt, packed_data, toread, &dataoffset, &nread, rmode);
    }

    return rv;
}